

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

FieldSubset * __thiscall
capnp::StructSchema::getNonUnionFields(FieldSubset *__return_storage_ptr__,StructSchema *this)

{
  RawBrandedSchema *pRVar1;
  uint16_t *puVar2;
  ushort uVar3;
  Reader fields;
  Reader local_78;
  Reader local_48;
  
  Schema::getProto(&local_48,&this->super_Schema);
  capnp::schema::Node::Struct::Reader::getFields(&local_78,(Reader *)&local_48);
  if (local_48._reader.dataSize < 0x100) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)((long)local_48._reader.data + 0x1e);
  }
  pRVar1 = (this->super_Schema).raw;
  (__return_storage_ptr__->list).reader.structDataSize = local_78.reader.structDataSize;
  (__return_storage_ptr__->list).reader.structPointerCount = local_78.reader.structPointerCount;
  (__return_storage_ptr__->list).reader.elementSize = local_78.reader.elementSize;
  (__return_storage_ptr__->list).reader.field_0x27 = local_78.reader._39_1_;
  (__return_storage_ptr__->list).reader.nestingLimit = local_78.reader.nestingLimit;
  *(undefined4 *)&(__return_storage_ptr__->list).reader.field_0x2c = local_78.reader._44_4_;
  (__return_storage_ptr__->list).reader.ptr = local_78.reader.ptr;
  (__return_storage_ptr__->list).reader.elementCount = local_78.reader.elementCount;
  (__return_storage_ptr__->list).reader.step = local_78.reader.step;
  (__return_storage_ptr__->list).reader.segment = local_78.reader.segment;
  (__return_storage_ptr__->list).reader.capTable = local_78.reader.capTable;
  puVar2 = pRVar1->generic->membersByDiscriminant;
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  __return_storage_ptr__->indices = (uint16_t *)((ulong)((uint)uVar3 + (uint)uVar3) + (long)puVar2);
  __return_storage_ptr__->size_ = local_78.reader.elementCount - uVar3;
  return __return_storage_ptr__;
}

Assistant:

StructSchema::FieldSubset StructSchema::getNonUnionFields() const {
  auto proto = getProto().getStruct();
  auto fields = proto.getFields();
  auto offset = proto.getDiscriminantCount();
  auto size = fields.size() - offset;
  return FieldSubset(*this, fields, raw->generic->membersByDiscriminant + offset, size);
}